

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  int iVar1;
  int max_00;
  int iVar2;
  _xmlNode *p_Var3;
  xmlSchemaAnnotPtr pxVar4;
  int max;
  int min;
  xmlChar *refNs;
  xmlChar *ref;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaParticlePtr item;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attr = (xmlAttrPtr)0x0;
  refNs = (xmlChar *)0x0;
  _max = (xmlChar *)0x0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    item = (xmlSchemaParticlePtr)node;
    node_local = (xmlNodePtr)schema;
    schema_local = (xmlSchemaPtr)ctxt;
    ref = (xmlChar *)xmlSchemaGetPropNode(node,"ref");
    if ((xmlAttrPtr)ref == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)item,"ref",(char *)0x0);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      iVar1 = xmlSchemaPValAttrNodeQName
                        ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)ref,(xmlChar **)&max,&refNs);
      if (iVar1 == 0) {
        xmlSchemaCheckReference
                  ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,(xmlNodePtr)item,
                   (xmlAttrPtr)ref,_max);
        iVar1 = xmlGetMinOccurs((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)item,0,-1,1,
                                "xs:nonNegativeInteger");
        max_00 = xmlGetMaxOccurs((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)item,0,0x40000000,
                                 1,"(xs:nonNegativeInteger | unbounded)");
        for (ref = (xmlChar *)item[1].node; ref != (xmlChar *)0x0; ref = *(xmlChar **)(ref + 0x30))
        {
          if (*(long *)(ref + 0x48) == 0) {
            iVar2 = xmlStrEqual(*(xmlChar **)(ref + 0x10),"ref");
            if (((iVar2 == 0) && (iVar2 = xmlStrEqual(*(xmlChar **)(ref + 0x10),"id"), iVar2 == 0))
               && ((iVar2 = xmlStrEqual(*(xmlChar **)(ref + 0x10),(xmlChar *)"minOccurs"),
                   iVar2 == 0 &&
                   (iVar2 = xmlStrEqual(*(xmlChar **)(ref + 0x10),(xmlChar *)"maxOccurs"),
                   iVar2 == 0)))) {
              xmlSchemaPIllegalAttrErr
                        ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                         (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)ref);
            }
          }
          else {
            iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(ref + 0x48) + 0x10),xmlSchemaNs);
            if (iVar2 != 0) {
              xmlSchemaPIllegalAttrErr
                        ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                         (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)ref);
            }
          }
        }
        xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)item,"id");
        child = (xmlNodePtr)
                xmlSchemaAddParticle
                          ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)item,iVar1,max_00);
        if (child == (xmlNodePtr)0x0) {
          ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
        }
        else {
          p_Var3 = (_xmlNode *)
                   xmlSchemaNewQNameRef
                             ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMA_TYPE_GROUP,refNs,_max)
          ;
          child->children = p_Var3;
          xmlSchemaPCheckParticleCorrect_2
                    ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaParticlePtr)child,
                     (xmlNodePtr)item,iVar1,max_00);
          attr = (xmlAttrPtr)item->children;
          if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
             ((iVar2 = xmlStrEqual(attr->name,(xmlChar *)"annotation"), iVar2 != 0 &&
              (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)))) {
            pxVar4 = xmlSchemaParseAnnotation
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
            *(xmlSchemaAnnotPtr *)&child->type = pxVar4;
            attr = attr->next;
          }
          if (attr != (xmlAttrPtr)0x0) {
            xmlSchemaPContentErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)item,(xmlNodePtr)attr,(char *)0x0,
                       "(annotation?)");
          }
          if ((iVar1 == 0) && (max_00 == 0)) {
            ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
          }
          else {
            ctxt_local = (xmlSchemaParserCtxtPtr)child;
          }
        }
      }
      else {
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)ctxt_local;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroupDefRef(xmlSchemaParserCtxtPtr ctxt,
			       xmlSchemaPtr schema,
			       xmlNodePtr node)
{
    xmlSchemaParticlePtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *ref = NULL, *refNs = NULL;
    int min, max;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "ref");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "ref", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNodeQName(ctxt, schema, NULL,
	attr, &refNs, &ref) != 0) {
	return (NULL);
    }
    xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
	"(xs:nonNegativeInteger | unbounded)");
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "ref")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "maxOccurs"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    item = xmlSchemaAddParticle(ctxt, node, min, max);
    if (item == NULL)
	return (NULL);
    /*
    * Create a qname-reference and set as the term; it will be substituted
    * for the model group after the reference has been resolved.
    */
    item->children = (xmlSchemaTreeItemPtr)
	xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_GROUP, ref, refNs);
    xmlSchemaPCheckParticleCorrect_2(ctxt, item, node, min, max);
    /*
    * And now for the children...
    */
    child = node->children;
    /* TODO: Is annotation even allowed for a model group reference? */
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* TODO: What to do exactly with the annotation?
	*/
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?)");
    }
    /*
    * Corresponds to no component at all if minOccurs==maxOccurs==0.
    */
    if ((min == 0) && (max == 0))
	return (NULL);

    return ((xmlSchemaTreeItemPtr) item);
}